

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O2

void luaK_nil(FuncState *fs,int from,int n)

{
  int iVar1;
  uint uVar2;
  Instruction *pIVar3;
  int iVar4;
  
  iVar1 = fs->pc;
  if (fs->lasttarget < iVar1) {
    if (iVar1 == 0) {
      if (from < (int)(uint)fs->nactvar) goto LAB_0010cac4;
    }
    else {
      pIVar3 = fs->f->code;
      uVar2 = pIVar3[(long)iVar1 + -1];
      if (((uVar2 & 0x3f) != 3) ||
         ((int)((uVar2 >> 0x17) + 1) < from || from < (int)(uVar2 >> 6 & 0xff))) goto LAB_0010cac4;
      iVar4 = from + n + -1;
      if ((int)(uVar2 >> 0x17) < iVar4) {
        pIVar3[(long)iVar1 + -1] = iVar4 * 0x800000 | uVar2 & 0x7fffc3;
      }
    }
    return;
  }
LAB_0010cac4:
  luaK_codeABC(fs,OP_LOADNIL,from,from + n + -1,0);
  return;
}

Assistant:

static void luaK_nil(FuncState*fs,int from,int n){
Instruction*previous;
if(fs->pc>fs->lasttarget){
if(fs->pc==0){
if(from>=fs->nactvar)
return;
}
else{
previous=&fs->f->code[fs->pc-1];
if(GET_OPCODE(*previous)==OP_LOADNIL){
int pfrom=GETARG_A(*previous);
int pto=GETARG_B(*previous);
if(pfrom<=from&&from<=pto+1){
if(from+n-1>pto)
SETARG_B(*previous,from+n-1);
return;
}
}
}
}
luaK_codeABC(fs,OP_LOADNIL,from,from+n-1,0);
}